

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

bool add_buf(BUFFER *buffer,char *string)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  char *pcVar4;
  int iVar5;
  
  cVar1 = *string;
  if (cVar1 != '\0') {
    pcVar4 = buffer->string;
    if (pcVar4 != (char *)0x0) {
      sVar2 = strlen(pcVar4);
      if (sVar2 != 0) {
        sVar3 = strlen(string);
        iVar5 = (int)sVar3 + (int)sVar2 + 1;
        if (iVar5 < 0x7fff) {
          __dest = (char *)operator_new__((long)iVar5);
          buffer->string = __dest;
          buffer->size = (short)iVar5;
          strcpy(__dest,pcVar4);
          strcat(__dest,string);
          operator_delete__(pcVar4);
        }
        goto LAB_0030fb17;
      }
    }
    pcVar4 = palloc_string(string);
    buffer->string = pcVar4;
    sVar2 = strlen(string);
    buffer->size = (short)sVar2 + 1;
  }
LAB_0030fb17:
  return cVar1 != '\0';
}

Assistant:

bool add_buf(BUFFER *buffer, char *string)
{
	int len;
	char *tptr;

	if (string[0] == '\0' || string == nullptr)
		return false;

	if (!buffer->string || !strlen(buffer->string)) // like a virgin.. touched for the very first tiiiiime
	{
		buffer->string = palloc_string(string);
		buffer->size = strlen(string) + 1;
		return true;
	}

	len = strlen(buffer->string) + strlen(string) + 1;

	if (len > 32766)
		return true;

	tptr = buffer->string;
	buffer->string = new char[len];

	if (!buffer->string)
		return false;

	buffer->size = len;

	strcpy(buffer->string, tptr);
	strcat(buffer->string, string);

	delete[] tptr;
	return true;
}